

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::DispatchProbeHandlers(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_30;
  anon_class_16_2_8f409ebb local_28;
  InterpreterHaltState *local_18;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  local_18 = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  bVar1 = CanDispatchHalt(this,pHaltState);
  if (bVar1) {
    local_28.pHaltState = &local_18;
    local_30.this = this;
    local_28.this = this;
    TryFinally<Js::ProbeContainer::DispatchProbeHandlers(Js::InterpreterHaltState*)::__0,Js::ProbeContainer::DispatchProbeHandlers(Js::InterpreterHaltState*)::__1>
              (&local_28,&local_30);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchProbeHandlers(InterpreterHaltState* pHaltState)
    {
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);

            if (pHaltState->IsValid())
            {
                Js::ProbeList * localPendingProbeList = this->pendingProbeList;
                diagProbeList->Map([pHaltState, localPendingProbeList](int index, Probe * probe)
                {
                    if (probe->CanHalt(pHaltState))
                    {
                        localPendingProbeList->Add(probe);
                    }
                });

                if (localPendingProbeList->Count() != 0)
                {
                    localPendingProbeList->MapUntil([&](int index, Probe * probe)
                    {
                        if (haltCallbackProbe && !haltCallbackProbe->IsInClosedState())
                        {
                            debugManager->stepController.Deactivate(pHaltState);
                            debugManager->asyncBreakController.Deactivate();
                            haltCallbackProbe->DispatchHalt(pHaltState);
                        }
                        // If SetNextStatement happened between multiple BPs on same location, IP changed so rest of dispatch are not valid.
                        return this->IsSetNextStatementCalled();
                    });
                }
            }
        },
        [&](bool)
        {
            pendingProbeList->Clear();
            DestroyLocation();
        });
    }